

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDReplace(TranslateToFuzzReader *this)

{
  SIMDReplaceOp SVar1;
  Index IVar2;
  FeatureOptions<wasm::SIMDReplaceOp> *pFVar3;
  Expression *value_00;
  SIMDReplace *pSVar4;
  Expression *value;
  Type local_b0;
  Type local_a8;
  Type local_a0;
  Type local_98;
  Type local_90;
  Type local_88;
  Type local_80;
  Type lane_t;
  Type TStack_70;
  uint8_t index;
  Expression *local_68;
  Expression *vec;
  FeatureSet local_4c;
  FeatureOptions<wasm::SIMDReplaceOp> local_48;
  SIMDReplaceOp local_14;
  TranslateToFuzzReader *pTStack_10;
  SIMDReplaceOp op;
  TranslateToFuzzReader *this_local;
  
  local_48.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_48.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_48.options._M_t._M_impl._0_8_ = 0;
  local_48.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  pTStack_10 = this;
  Random::FeatureOptions<wasm::SIMDReplaceOp>::FeatureOptions(&local_48);
  FeatureSet::FeatureSet(&local_4c,8);
  pFVar3 = Random::FeatureOptions<wasm::SIMDReplaceOp>::
           add<wasm::SIMDReplaceOp,wasm::SIMDReplaceOp,wasm::SIMDReplaceOp,wasm::SIMDReplaceOp,wasm::SIMDReplaceOp>
                     (&local_48,local_4c,ReplaceLaneVecI8x16,ReplaceLaneVecI16x8,ReplaceLaneVecI32x4
                      ,ReplaceLaneVecI64x2,ReplaceLaneVecF32x4,ReplaceLaneVecF64x2);
  FeatureSet::FeatureSet((FeatureSet *)&vec,0x40000);
  pFVar3 = Random::FeatureOptions<wasm::SIMDReplaceOp>::add<>(pFVar3,vec._0_4_,ReplaceLaneVecF16x8);
  SVar1 = pick<wasm::SIMDReplaceOp>(this,pFVar3);
  Random::FeatureOptions<wasm::SIMDReplaceOp>::~FeatureOptions(&local_48);
  local_14 = SVar1;
  Type::Type(&stack0xffffffffffffff90,v128);
  local_68 = make(this,TStack_70);
  Type::Type(&local_80);
  switch(local_14) {
  case ReplaceLaneVecI8x16:
    IVar2 = upTo(this,0x10);
    lane_t.id._7_1_ = (uint8_t)IVar2;
    Type::Type(&local_88,i32);
    local_80.id = local_88.id;
    break;
  case ReplaceLaneVecI16x8:
    IVar2 = upTo(this,8);
    lane_t.id._7_1_ = (uint8_t)IVar2;
    Type::Type(&local_90,i32);
    local_80.id = local_90.id;
    break;
  case ReplaceLaneVecI32x4:
    IVar2 = upTo(this,4);
    lane_t.id._7_1_ = (uint8_t)IVar2;
    Type::Type(&local_98,i32);
    local_80.id = local_98.id;
    break;
  case ReplaceLaneVecI64x2:
    IVar2 = upTo(this,2);
    lane_t.id._7_1_ = (uint8_t)IVar2;
    Type::Type(&local_a0,i64);
    local_80.id = local_a0.id;
    break;
  case ReplaceLaneVecF16x8:
    IVar2 = upTo(this,8);
    lane_t.id._7_1_ = (uint8_t)IVar2;
    Type::Type(&local_a8,f32);
    local_80.id = local_a8.id;
    break;
  case ReplaceLaneVecF32x4:
    IVar2 = upTo(this,4);
    lane_t.id._7_1_ = (uint8_t)IVar2;
    Type::Type(&local_b0,f32);
    local_80.id = local_b0.id;
    break;
  case ReplaceLaneVecF64x2:
    IVar2 = upTo(this,2);
    lane_t.id._7_1_ = (uint8_t)IVar2;
    Type::Type((Type *)&value,f64);
    local_80.id = (uintptr_t)value;
    break;
  default:
    ::wasm::handle_unreachable
              ("unexpected op",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0x11f1);
  }
  value_00 = make(this,local_80);
  pSVar4 = Builder::makeSIMDReplace(&this->builder,local_14,local_68,lane_t.id._7_1_,value_00);
  return (Expression *)pSVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDReplace() {
  SIMDReplaceOp op =
    pick(FeatureOptions<SIMDReplaceOp>()
           .add(FeatureSet::SIMD,
                ReplaceLaneVecI8x16,
                ReplaceLaneVecI16x8,
                ReplaceLaneVecI32x4,
                ReplaceLaneVecI64x2,
                ReplaceLaneVecF32x4,
                ReplaceLaneVecF64x2)
           .add(FeatureSet::FeatureSet::FP16, ReplaceLaneVecF16x8));
  Expression* vec = make(Type::v128);
  uint8_t index;
  Type lane_t;
  switch (op) {
    case ReplaceLaneVecI8x16:
      index = upTo(16);
      lane_t = Type::i32;
      break;
    case ReplaceLaneVecI16x8:
      index = upTo(8);
      lane_t = Type::i32;
      break;
    case ReplaceLaneVecI32x4:
      index = upTo(4);
      lane_t = Type::i32;
      break;
    case ReplaceLaneVecI64x2:
      index = upTo(2);
      lane_t = Type::i64;
      break;
    case ReplaceLaneVecF16x8:
      index = upTo(8);
      lane_t = Type::f32;
      break;
    case ReplaceLaneVecF32x4:
      index = upTo(4);
      lane_t = Type::f32;
      break;
    case ReplaceLaneVecF64x2:
      index = upTo(2);
      lane_t = Type::f64;
      break;
    default:
      WASM_UNREACHABLE("unexpected op");
  }
  Expression* value = make(lane_t);
  return builder.makeSIMDReplace(op, vec, index, value);
}